

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QLayout *layout)

{
  bool bVar1;
  QFormLayoutPrivate *this_00;
  QLayout *in_RDI;
  QLayoutPrivate *unaff_retaddr;
  QFormLayoutPrivate *d;
  QLayout *otherLayout;
  
  otherLayout = in_RDI;
  this_00 = d_func((QFormLayout *)0x4b61e4);
  bVar1 = QLayoutPrivate::checkLayout(unaff_retaddr,otherLayout);
  if (bVar1) {
    QFormLayoutPrivate::insertRow(this_00,(int)((ulong)in_RDI >> 0x20));
    QFormLayoutPrivate::setLayout
              ((QFormLayoutPrivate *)layout,d._4_4_,(ItemRole)d,(QLayout *)unaff_retaddr);
    (**(code **)(*(long *)in_RDI + 0x70))();
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, QLayout *layout)
{
    Q_D(QFormLayout);
    if (!d->checkLayout(layout))
        return;

    row = d->insertRow(row);
    d->setLayout(row, SpanningRole, layout);
    invalidate();
}